

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O0

Collision * __thiscall Plane::collide(Plane *this,Ray *ray)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uchar *in_RCX;
  Vector3 *in_RDX;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  uchar *in_RSI;
  Vector3 *pVVar4;
  Collision *in_RDI;
  Collision *ctx;
  Vector3 *pVVar5;
  Vector3 *this_00;
  size_t in_R8;
  double dVar6;
  double t;
  double x;
  Collision *coll;
  undefined4 in_stack_ffffffffffffff20;
  Primitive *in_stack_ffffffffffffff48;
  Collision *this_01;
  uchar *dis;
  undefined4 in_stack_ffffffffffffff68;
  Vector3 local_90;
  Vector3 local_78;
  double local_60;
  Vector3 local_58;
  double local_40;
  undefined1 local_21;
  double local_20;
  Vector3 *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  local_20 = Vector3::dot((Vector3 *)(in_RSI + 0x80),in_RDX + 1);
  local_21 = 0;
  ctx = in_RDI;
  dis = in_RSI;
  Collision::Collision(this_01,in_stack_ffffffffffffff48);
  iVar2 = sign((EVP_PKEY_CTX *)ctx,in_RSI,siglen,in_RCX,in_R8);
  if (iVar2 != 0) {
    dVar1 = *(double *)(dis + 0xd0);
    pVVar5 = (Vector3 *)(dis + 0x80);
    pVVar4 = local_18;
    dVar6 = Vector3::dot(pVVar5,local_18);
    local_40 = -(dVar1 + dVar6) / local_20;
    iVar3 = sign((EVP_PKEY_CTX *)pVVar5,(uchar *)pVVar4,siglen_00,in_RCX,in_R8);
    if (0 < iVar3) {
      in_RDI->crash = true;
      in_RDI->dist = local_40;
      this_00 = (Vector3 *)(dis + 0x80);
      pVVar5 = local_18 + 1;
      pVVar4 = this_00;
      Vector3::dot(this_00,pVVar5);
      iVar3 = sign((EVP_PKEY_CTX *)this_00,(uchar *)pVVar5,siglen_01,in_RCX,in_R8);
      local_60 = (double)-iVar3;
      ::operator*(pVVar4,(double *)CONCAT44(iVar3,in_stack_ffffffffffffff20));
      (in_RDI->N).z = local_58.z;
      (in_RDI->N).x = local_58.x;
      (in_RDI->N).y = local_58.y;
      Vector3::~Vector3(&local_58);
      Ray::travel((Ray *)CONCAT44(iVar2,in_stack_ffffffffffffff68),(double)dis);
      (in_RDI->P).z = local_78.z;
      (in_RDI->P).x = local_78.x;
      (in_RDI->P).y = local_78.y;
      Vector3::~Vector3(&local_78);
      (*(code *)**(undefined8 **)dis)(&local_90,dis,&in_RDI->P);
      (in_RDI->color).x = local_90.x;
      (in_RDI->color).y = local_90.y;
      (in_RDI->color).z = local_90.z;
      Vector3::~Vector3(&local_90);
    }
  }
  return this_01;
}

Assistant:

Collision Plane::collide(const Ray &ray) {
    double x = N.dot(ray.V);
    Collision coll(this);
    if (!sign(x)) return coll;
    double t = -(D + N.dot(ray.O)) / x;
    if (sign(t) <= 0) return coll;
    coll.crash = true;
    coll.dist = t;
    coll.N = N * -sign(N.dot(ray.V));
    coll.P = ray.travel(t);
    coll.color = getColor(coll.P);
    return coll;
}